

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O1

Error asmjit::Logging::formatLine
                (StringBuilder *sb,uint8_t *binData,size_t binLen,size_t dispLen,size_t imLen,
                char *comment)

{
  size_t sVar1;
  bool bVar2;
  Error EVar3;
  size_t i;
  size_t len;
  int iVar4;
  ulong uVar5;
  Error unaff_R15D;
  char local_71;
  ulong local_70;
  ulong local_68;
  
  len = 0;
  if (comment != (char *)0x0) {
    do {
      if (comment[len] == '\0') goto LAB_0015ccee;
      len = len + 1;
    } while (len != 0x200);
    len = 0x200;
  }
LAB_0015ccee:
  if (binLen < dispLen) {
    formatLine();
  }
  if (binLen - 1 < 0xfffffffffffffffe || len != 0) {
    local_70 = sb->_length;
    uVar5 = (ulong)(binLen == 0xffffffffffffffff);
    local_71 = ';';
    local_68 = 0x28;
    do {
      sVar1 = sb->_length;
      if (local_68 < local_70 || local_68 - local_70 == 0) {
LAB_0015cd99:
        iVar4 = 1;
        EVar3 = StringBuilder::_opChar(sb,1,local_71);
        if (EVar3 != 0) goto LAB_0015cdd9;
        iVar4 = 1;
        EVar3 = StringBuilder::_opChar(sb,1,' ');
        if (EVar3 != 0) goto LAB_0015cdd9;
        iVar4 = 1;
        if (uVar5 == 0) {
          EVar3 = StringBuilder::_opHex(sb,1,binData,binLen - (dispLen + imLen));
          if (EVar3 == 0) {
            iVar4 = 1;
            EVar3 = StringBuilder::_opChars(sb,1,'.',dispLen * 2);
            if (EVar3 == 0) {
              iVar4 = 1;
              EVar3 = StringBuilder::_opHex(sb,1,binData + (binLen - imLen),imLen);
              if (EVar3 == 0) {
                if (len != 0) goto LAB_0015ce1d;
                iVar4 = 4;
                EVar3 = unaff_R15D;
              }
            }
          }
          goto LAB_0015cdd9;
        }
        EVar3 = StringBuilder::_opString(sb,1,comment,len);
        if (EVar3 != 0) goto LAB_0015cdd9;
LAB_0015ce1d:
        local_70 = (local_70 - sVar1) + sb->_length;
        local_68 = local_68 + 0x1a;
        local_71 = '|';
        iVar4 = 0;
        bVar2 = true;
      }
      else {
        iVar4 = 1;
        EVar3 = StringBuilder::_opChars(sb,1,' ',local_68 - local_70);
        if (EVar3 == 0) goto LAB_0015cd99;
LAB_0015cdd9:
        bVar2 = false;
        unaff_R15D = EVar3;
      }
      if (!bVar2) goto LAB_0015cec3;
      uVar5 = uVar5 + 1;
    } while (uVar5 == 1);
    iVar4 = 4;
LAB_0015cec3:
    if (iVar4 != 4) {
      return unaff_R15D;
    }
  }
  EVar3 = StringBuilder::_opChar(sb,1,'\n');
  return EVar3;
}

Assistant:

Error Logging::formatLine(StringBuilder& sb, const uint8_t* binData, size_t binLen, size_t dispLen, size_t imLen, const char* comment) noexcept {
  size_t currentLen = sb.getLength();
  size_t commentLen = comment ? Utils::strLen(comment, kMaxCommentLength) : 0;

  ASMJIT_ASSERT(binLen >= dispLen);

  if ((binLen != 0 && binLen != Globals::kInvalidIndex) || commentLen) {
    size_t align = kMaxInstLength;
    char sep = ';';

    for (size_t i = (binLen == Globals::kInvalidIndex); i < 2; i++) {
      size_t begin = sb.getLength();

      // Append align.
      if (currentLen < align)
        ASMJIT_PROPAGATE(sb.appendChars(' ', align - currentLen));

      // Append separator.
      if (sep) {
        ASMJIT_PROPAGATE(sb.appendChar(sep));
        ASMJIT_PROPAGATE(sb.appendChar(' '));
      }

      // Append binary data or comment.
      if (i == 0) {
        ASMJIT_PROPAGATE(sb.appendHex(binData, binLen - dispLen - imLen));
        ASMJIT_PROPAGATE(sb.appendChars('.', dispLen * 2));
        ASMJIT_PROPAGATE(sb.appendHex(binData + binLen - imLen, imLen));
        if (commentLen == 0) break;
      }
      else {
        ASMJIT_PROPAGATE(sb.appendString(comment, commentLen));
      }

      currentLen += sb.getLength() - begin;
      align += kMaxBinaryLength;
      sep = '|';
    }
  }

  return sb.appendChar('\n');
}